

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_2::verifyImageWithVerifier
               (Surface *resultImage,TestLog *log,Verifier *verifier,bool logOnSuccess)

{
  RGBA RVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  MessageBuilder *pMVar5;
  TestLog *pTVar6;
  ConstPixelBufferAccess local_960;
  allocator<char> local_931;
  string local_930;
  allocator<char> local_909;
  string local_908;
  LogImage local_8e8;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  LogImageSet local_808;
  MessageBuilder local_7c8;
  ConstPixelBufferAccess local_648;
  allocator<char> local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  LogImage local_5d0;
  ConstPixelBufferAccess local_540;
  allocator<char> local_511;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  LogImage local_4c8;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  LogImageSet local_3e8;
  MessageBuilder local_3a8;
  deUint32 local_228;
  Vector<int,_2> local_224;
  deUint32 local_21c;
  int local_218;
  RGBA color;
  int x;
  int y;
  Vector<float,_4> local_8c;
  PixelBufferAccess local_70;
  byte local_41;
  undefined1 local_40 [7];
  bool error;
  Surface errorMask;
  bool logOnSuccess_local;
  Verifier *verifier_local;
  TestLog *log_local;
  Surface *resultImage_local;
  
  errorMask.m_pixels.m_cap._7_1_ = logOnSuccess;
  iVar3 = tcu::Surface::getWidth(resultImage);
  iVar4 = tcu::Surface::getHeight(resultImage);
  tcu::Surface::Surface((Surface *)local_40,iVar3,iVar4);
  local_41 = 0;
  tcu::Surface::getAccess(&local_70,(Surface *)local_40);
  tcu::Vector<float,_4>::Vector(&local_8c,0.0,1.0,0.0,1.0);
  tcu::clear(&local_70,&local_8c);
  if ((errorMask.m_pixels.m_cap._7_1_ & 1) != 0) {
    tcu::TestLog::operator<<((MessageBuilder *)&x,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)&x,(char (*) [17])"Verifying image.")
    ;
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x);
    (*verifier->_vptr_Verifier[1])(verifier,log);
  }
  for (color.m_value = 0; RVar1.m_value = color.m_value,
      iVar3 = tcu::Surface::getHeight(resultImage), (int)RVar1.m_value < iVar3;
      color.m_value = color.m_value + 1) {
    for (local_218 = 0; iVar3 = local_218, iVar4 = tcu::Surface::getWidth(resultImage),
        iVar3 < iVar4; local_218 = local_218 + 1) {
      local_21c = (deUint32)tcu::Surface::getPixel(resultImage,local_218,color.m_value);
      tcu::Vector<int,_2>::Vector(&local_224,local_218,color.m_value);
      iVar4 = (**verifier->_vptr_Verifier)(verifier,&local_21c,&local_224);
      RVar1 = color;
      iVar3 = local_218;
      if ((((byte)iVar4 ^ 0xff) & 1) != 0) {
        local_41 = 1;
        local_228 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)local_40,iVar3,RVar1.m_value,(RGBA)local_228);
      }
    }
  }
  if ((local_41 & 1) == 0) {
    if ((errorMask.m_pixels.m_cap._7_1_ & 1) != 0) {
      tcu::TestLog::operator<<(&local_7c8,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_7c8,(char (*) [27])"Image verification passed.");
      pTVar6 = tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_828,"Verification",&local_829);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_850,"Image Verification",&local_851);
      tcu::LogImageSet::LogImageSet(&local_808,&local_828,&local_850);
      pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_808);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"Result",&local_909);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_930,"Result image",&local_931);
      tcu::Surface::getAccess(&local_960,resultImage);
      tcu::LogImage::LogImage
                (&local_8e8,&local_908,&local_930,&local_960,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_8e8);
      tcu::TestLog::operator<<(pTVar6,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::LogImage::~LogImage(&local_8e8);
      std::__cxx11::string::~string((string *)&local_930);
      std::allocator<char>::~allocator(&local_931);
      std::__cxx11::string::~string((string *)&local_908);
      std::allocator<char>::~allocator(&local_909);
      tcu::LogImageSet::~LogImageSet(&local_808);
      std::__cxx11::string::~string((string *)&local_850);
      std::allocator<char>::~allocator(&local_851);
      std::__cxx11::string::~string((string *)&local_828);
      std::allocator<char>::~allocator(&local_829);
      tcu::MessageBuilder::~MessageBuilder(&local_7c8);
    }
  }
  else {
    if ((errorMask.m_pixels.m_cap._7_1_ & 1) == 0) {
      (*verifier->_vptr_Verifier[1])(verifier,log);
    }
    tcu::TestLog::operator<<(&local_3a8,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_3a8,(char (*) [27])"Image verification failed.")
    ;
    pTVar6 = tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"Verification",&local_409);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"Image Verification",&local_431);
    tcu::LogImageSet::LogImageSet(&local_3e8,&local_408,&local_430);
    pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_3e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"Result",&local_4e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"Result image",&local_511);
    tcu::Surface::getAccess(&local_540,resultImage);
    tcu::LogImage::LogImage
              (&local_4c8,&local_4e8,&local_510,&local_540,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_4c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,"ErrorMask",&local_5f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"Error Mask",&local_619)
    ;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_648,(Surface *)local_40);
    tcu::LogImage::LogImage
              (&local_5d0,&local_5f0,&local_618,&local_648,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_5d0);
    tcu::TestLog::operator<<(pTVar6,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_5d0);
    std::__cxx11::string::~string((string *)&local_618);
    std::allocator<char>::~allocator(&local_619);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::allocator<char>::~allocator(&local_5f1);
    tcu::LogImage::~LogImage(&local_4c8);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator(&local_511);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    tcu::LogImageSet::~LogImageSet(&local_3e8);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
    tcu::MessageBuilder::~MessageBuilder(&local_3a8);
  }
  bVar2 = local_41 ^ 0xff;
  tcu::Surface::~Surface((Surface *)local_40);
  return (bool)(bVar2 & 1);
}

Assistant:

static bool verifyImageWithVerifier (const tcu::Surface& resultImage, tcu::TestLog& log, const Verifier& verifier, bool logOnSuccess = true)
{
	tcu::Surface	errorMask	(resultImage.getWidth(), resultImage.getHeight());
	bool			error		= false;

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	if (logOnSuccess)
	{
		log << tcu::TestLog::Message << "Verifying image." << tcu::TestLog::EndMessage;
		verifier.logInfo(log);
	}

	for (int y = 0; y < resultImage.getHeight(); ++y)
	for (int x = 0; x < resultImage.getWidth(); ++x)
	{
		const tcu::RGBA color		= resultImage.getPixel(x, y);

		// verify color value is valid for this pixel position
		if (!verifier.verify(color, tcu::IVec2(x,y)))
		{
			error = true;
			errorMask.setPixel(x, y, tcu::RGBA::red());
		}
	}

	if (error)
	{
		// describe the verification logic if we haven't already
		if (!logOnSuccess)
			verifier.logInfo(log);

		log	<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Verification", "Image Verification")
			<< tcu::TestLog::Image("Result", "Result image", resultImage.getAccess())
			<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
			<< tcu::TestLog::EndImageSet;
	}
	else if (logOnSuccess)
	{
		log << tcu::TestLog::Message << "Image verification passed." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Verification", "Image Verification")
			<< tcu::TestLog::Image("Result", "Result image", resultImage.getAccess())
			<< tcu::TestLog::EndImageSet;
	}

	return !error;
}